

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O3

void secp256k1_modinv32(secp256k1_modinv32_signed30 *x,secp256k1_modinv32_modinfo *modinfo)

{
  secp256k1_scalar *a;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  uint32_t uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  secp256k1_modinv32_signed30 *b;
  uint uVar11;
  int extraout_EDX;
  uint uVar12;
  int extraout_EDX_00;
  int extraout_EDX_01;
  long lVar13;
  secp256k1_modinv32_signed30 *a_00;
  int *extraout_RDX;
  uint *extraout_RDX_00;
  int32_t *piVar14;
  long lVar15;
  secp256k1_modinv32_signed30 *b_00;
  ulong uVar16;
  long *extraout_RDX_01;
  uint uVar17;
  secp256k1_modinv32_signed30 *unaff_RBX;
  int *piVar18;
  secp256k1_modinv32_signed30 *psVar19;
  ulong uVar20;
  uint64_t uVar21;
  secp256k1_fe *psVar22;
  ulong uVar23;
  secp256k1_fe *r;
  secp256k1_modinv32_signed30 *psVar24;
  secp256k1_modinv32_signed30 *a_01;
  secp256k1_modinv32_signed30 *a_02;
  long lVar25;
  ulong uVar26;
  secp256k1_fe *r_00;
  secp256k1_fe *psVar27;
  uchar *__s;
  ulong uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  int *piVar32;
  long lVar33;
  uint uVar34;
  uint uVar35;
  ulong uVar36;
  secp256k1_modinv32_signed30 *psVar37;
  uint uVar38;
  secp256k1_modinv32_modinfo *unaff_R13;
  secp256k1_modinv32_modinfo *psVar39;
  secp256k1_modinv32_signed30 *psVar40;
  uint64_t uVar41;
  size_t count;
  uint uVar42;
  secp256k1_modinv32_signed30 *unaff_R14;
  uint64_t uVar43;
  secp256k1_fe *a_03;
  uint uVar44;
  ulong unaff_R15;
  uint64_t uVar45;
  code *pcVar46;
  bool bVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  uint32_t c1;
  secp256k1_modinv32_trans2x2 t;
  secp256k1_modinv32_signed30 f;
  secp256k1_modinv32_signed30 g;
  secp256k1_modinv32_signed30 d;
  ulong uStack_1488;
  secp256k1_fe *psStack_1480;
  uchar auStack_1478 [4232];
  secp256k1_fe *psStack_3f0;
  ulong uStack_3e8;
  uint64_t uStack_3e0;
  secp256k1_fe *psStack_3d8;
  code *pcStack_3d0;
  code *pcStack_3c8;
  undefined1 auStack_3c0 [36];
  int iStack_39c;
  int iStack_398;
  int iStack_394;
  int iStack_390;
  int iStack_38c;
  int iStack_388;
  int iStack_384;
  undefined1 auStack_380 [48];
  code *pcStack_350;
  long lStack_340;
  secp256k1_fe sStack_338;
  secp256k1_fe *psStack_300;
  secp256k1_fe sStack_2f8;
  secp256k1_fe sStack_2c8;
  ulong uStack_290;
  ulong uStack_288;
  ulong uStack_280;
  secp256k1_modinv32_signed30 *psStack_278;
  ulong uStack_270;
  code *pcStack_268;
  uint uStack_260;
  uint uStack_25c;
  uint uStack_258;
  uint uStack_254;
  uint uStack_250;
  uint uStack_24c;
  secp256k1_modinv32_signed30 *psStack_248;
  uint uStack_23c;
  uint uStack_238;
  uint uStack_234;
  uint uStack_230;
  int32_t iStack_22c;
  secp256k1_modinv32_signed30 *psStack_228;
  secp256k1_modinv32_signed30 *psStack_220;
  secp256k1_modinv32_signed30 *psStack_218;
  secp256k1_modinv32_signed30 *psStack_210;
  secp256k1_modinv32_signed30 *psStack_208;
  code *pcStack_200;
  long lStack_1f0;
  long lStack_1e8;
  int *piStack_1e0;
  ulong uStack_1d8;
  secp256k1_modinv32_modinfo *psStack_1d0;
  ulong uStack_1c0;
  code *pcStack_1b8;
  secp256k1_modinv32_signed30 *psStack_1b0;
  int *piStack_1a0;
  ulong uStack_198;
  secp256k1_modinv32_modinfo *psStack_190;
  ulong uStack_180;
  code *pcStack_178;
  secp256k1_modinv32_signed30 sStack_170;
  secp256k1_modinv32_signed30 sStack_14c;
  secp256k1_modinv32_signed30 *psStack_128;
  secp256k1_modinv32_signed30 *psStack_120;
  secp256k1_modinv32_modinfo *local_110;
  int local_104;
  uint local_100;
  uint local_fc;
  secp256k1_modinv32_trans2x2 local_f8;
  secp256k1_modinv32_signed30 local_e8;
  secp256k1_modinv32_signed30 *local_c0;
  long local_b8;
  undefined8 local_b0;
  secp256k1_modinv32_signed30 local_a8;
  secp256k1_modinv32_signed30 local_78;
  secp256k1_modinv32_signed30 local_54;
  
  local_78.v[4] = 0;
  local_78.v[5] = 0;
  local_78.v[6] = 0;
  local_78.v[7] = 0;
  local_78.v[0] = 0;
  local_78.v[1] = 0;
  local_78.v[2] = 0;
  local_78.v[3] = 0;
  local_78.v[8] = 0;
  local_54.v[5] = 0;
  local_54.v[6] = 0;
  local_54.v[7] = 0;
  local_54.v[8] = 0;
  local_54.v[1] = 0;
  local_54.v[2] = 0;
  local_54.v[3] = 0;
  local_54.v[4] = 0;
  local_54.v[0] = 1;
  local_e8.v[8] = (modinfo->modulus).v[8];
  local_e8.v._0_8_ = *(undefined8 *)(modinfo->modulus).v;
  local_e8.v._8_8_ = *(undefined8 *)((modinfo->modulus).v + 2);
  local_e8.v._16_8_ = *(undefined8 *)((modinfo->modulus).v + 4);
  local_e8.v._24_8_ = *(undefined8 *)((modinfo->modulus).v + 6);
  local_a8.v[8] = x->v[8];
  local_a8.v._0_8_ = *(undefined8 *)x->v;
  local_a8.v._8_8_ = *(undefined8 *)(x->v + 2);
  local_a8.v._16_8_ = *(undefined8 *)(x->v + 4);
  local_a8.v._24_8_ = *(undefined8 *)(x->v + 6);
  iVar4 = 0;
  uVar36 = 0xffffffff;
  local_110 = modinfo;
  local_c0 = x;
  do {
    local_b0 = (ulong)local_e8.v[0];
    uVar20 = (ulong)local_a8.v[0];
    uVar10 = 0;
    psVar24 = (secp256k1_modinv32_signed30 *)0x1;
    uVar5 = 0;
    uVar11 = 0;
    uVar29 = 1;
    uVar30 = local_a8.v[0];
    uVar31 = local_e8.v[0];
    do {
      uVar6 = local_e8.v[0];
      local_104 = iVar4;
      if ((uVar31 & 1) == 0) {
        psStack_120 = (secp256k1_modinv32_signed30 *)0x14b706;
        secp256k1_modinv32_cold_17();
LAB_0014b706:
        psStack_120 = (secp256k1_modinv32_signed30 *)0x14b70b;
        secp256k1_modinv32_cold_1();
LAB_0014b70b:
        psStack_120 = (secp256k1_modinv32_signed30 *)0x14b710;
        secp256k1_modinv32_cold_2();
        psVar39 = unaff_R13;
LAB_0014b710:
        uVar29 = uVar6;
        psStack_120 = (secp256k1_modinv32_signed30 *)0x14b715;
        secp256k1_modinv32_cold_16();
        goto LAB_0014b715;
      }
      uVar12 = (uint)psVar24;
      uVar42 = uVar5 * local_a8.v[0] + uVar12 * local_e8.v[0];
      unaff_R14 = (secp256k1_modinv32_signed30 *)(ulong)uVar42;
      uVar17 = uVar31 << ((byte)uVar10 & 0x1f);
      unaff_RBX = (secp256k1_modinv32_signed30 *)(ulong)uVar17;
      if (uVar42 != uVar17) goto LAB_0014b706;
      uVar42 = uVar29 * local_a8.v[0] + uVar11 * local_e8.v[0];
      unaff_R14 = (secp256k1_modinv32_signed30 *)(ulong)uVar42;
      uVar17 = uVar30 << ((byte)uVar10 & 0x1f);
      unaff_RBX = (secp256k1_modinv32_signed30 *)(ulong)uVar17;
      if (uVar42 != uVar17) goto LAB_0014b70b;
      local_fc = (int)(uint)uVar36 >> 0x1f;
      unaff_R14 = (secp256k1_modinv32_signed30 *)(ulong)local_fc;
      local_100 = uVar30 & 1;
      uVar17 = -local_100;
      unaff_R15 = (ulong)uVar17;
      uVar42 = local_fc & uVar17;
      unaff_RBX = (secp256k1_modinv32_signed30 *)(ulong)uVar42;
      uVar34 = (uint)uVar36 ^ uVar42;
      uVar36 = (ulong)uVar34;
      psVar39 = (secp256k1_modinv32_modinfo *)(ulong)(uVar34 - 0x25b);
      if (uVar34 - 0x25b < 0xfffffb4d) goto LAB_0014b710;
      uVar36 = (ulong)(uVar34 - 1);
      uVar29 = uVar29 + ((local_fc ^ uVar5) - local_fc & uVar17);
      uVar5 = (uVar5 + (uVar29 & uVar42)) * 2;
      uVar11 = uVar11 + ((local_fc ^ uVar12) - local_fc & uVar17);
      uVar6 = (uVar12 + (uVar11 & uVar42)) * 2;
      psVar24 = (secp256k1_modinv32_signed30 *)(ulong)uVar6;
      uVar17 = ((local_fc ^ uVar31) - local_fc & uVar17) + uVar30;
      uVar30 = uVar17 >> 1;
      uVar17 = uVar17 & uVar42;
      unaff_R13 = (secp256k1_modinv32_modinfo *)(ulong)uVar17;
      uVar31 = uVar31 + uVar17;
      uVar17 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar17;
    } while (uVar17 != 0x1e);
    unaff_R14 = (secp256k1_modinv32_signed30 *)(long)(int)uVar6;
    psVar39 = (secp256k1_modinv32_modinfo *)(long)(int)uVar5;
    unaff_R15 = (ulong)(int)uVar11;
    uVar10 = (long)unaff_R14 * (long)(int)uVar29 - (long)psVar39 * unaff_R15;
    local_f8.u = uVar6;
    local_f8.v = uVar5;
    local_f8.q = uVar11;
    local_f8.r = uVar29;
    if (uVar10 != 0x40000000) {
LAB_0014b715:
      psStack_120 = (secp256k1_modinv32_signed30 *)0x14b71a;
      secp256k1_modinv32_cold_3();
LAB_0014b71a:
      psStack_120 = (secp256k1_modinv32_signed30 *)0x14b71f;
      secp256k1_modinv32_cold_15();
LAB_0014b71f:
      psStack_120 = (secp256k1_modinv32_signed30 *)0x14b724;
      secp256k1_modinv32_cold_14();
LAB_0014b724:
      psStack_120 = (secp256k1_modinv32_signed30 *)0x14b729;
      secp256k1_modinv32_cold_13();
LAB_0014b729:
      psStack_120 = (secp256k1_modinv32_signed30 *)0x14b72e;
      secp256k1_modinv32_cold_12();
LAB_0014b72e:
      psStack_120 = (secp256k1_modinv32_signed30 *)0x14b733;
      secp256k1_modinv32_cold_4();
LAB_0014b733:
      unaff_R13 = psVar39;
      uVar5 = (uint)uVar10;
      psStack_120 = (secp256k1_modinv32_signed30 *)0x14b738;
      secp256k1_modinv32_cold_5();
LAB_0014b738:
      psStack_120 = (secp256k1_modinv32_signed30 *)0x14b73d;
      secp256k1_modinv32_cold_11();
LAB_0014b73d:
      psStack_120 = (secp256k1_modinv32_signed30 *)0x14b742;
      secp256k1_modinv32_cold_10();
LAB_0014b742:
      psStack_120 = (secp256k1_modinv32_signed30 *)0x14b747;
      secp256k1_modinv32_cold_9();
LAB_0014b747:
      psStack_120 = (secp256k1_modinv32_signed30 *)0x14b74c;
      secp256k1_modinv32_cold_8();
      goto LAB_0014b74c;
    }
    psStack_120 = (secp256k1_modinv32_signed30 *)0x14b43a;
    local_b8 = (long)(int)uVar29;
    secp256k1_modinv32_update_de_30(&local_78,&local_54,&local_f8,local_110);
    unaff_RBX = &local_e8;
    uVar29 = 9;
    uVar10 = 0xffffffff;
    psStack_120 = (secp256k1_modinv32_signed30 *)0x14b456;
    psVar24 = unaff_RBX;
    iVar4 = secp256k1_modinv32_mul_cmp_30(unaff_RBX,9,&local_110->modulus,-1);
    if (iVar4 < 1) goto LAB_0014b71a;
    uVar29 = 9;
    uVar10 = 1;
    psStack_120 = (secp256k1_modinv32_signed30 *)0x14b475;
    psVar24 = unaff_RBX;
    iVar4 = secp256k1_modinv32_mul_cmp_30(unaff_RBX,9,&local_110->modulus,1);
    if (0 < iVar4) goto LAB_0014b71f;
    unaff_RBX = &local_a8;
    uVar29 = 9;
    uVar10 = 0xffffffff;
    psStack_120 = (secp256k1_modinv32_signed30 *)0x14b499;
    psVar24 = unaff_RBX;
    iVar4 = secp256k1_modinv32_mul_cmp_30(unaff_RBX,9,&local_110->modulus,-1);
    if (iVar4 < 1) goto LAB_0014b724;
    uVar29 = 9;
    uVar10 = 1;
    psStack_120 = (secp256k1_modinv32_signed30 *)0x14b4b8;
    psVar24 = unaff_RBX;
    iVar4 = secp256k1_modinv32_mul_cmp_30(unaff_RBX,9,&local_110->modulus,1);
    unaff_R13 = local_110;
    if (-1 < iVar4) goto LAB_0014b729;
    unaff_RBX = (secp256k1_modinv32_signed30 *)((long)psVar39 * uVar20 + (long)unaff_R14 * local_b0)
    ;
    uVar10 = local_b0;
    if (((ulong)unaff_RBX & 0x3ffffffe) != 0) goto LAB_0014b72e;
    uVar10 = local_b0 * unaff_R15;
    uVar20 = uVar20 * local_b8 + uVar10;
    if ((uVar20 & 0x3fffffff) != 0) goto LAB_0014b733;
    uVar20 = (long)uVar20 >> 0x1e;
    unaff_RBX = (secp256k1_modinv32_signed30 *)((long)unaff_RBX >> 0x1e);
    lVar8 = 1;
    do {
      lVar33 = (long)unaff_RBX->v +
               (long)local_a8.v[lVar8] * (long)psVar39 + (long)local_e8.v[lVar8] * (long)unaff_R14;
      lVar13 = local_a8.v[lVar8] * local_b8 + (long)local_e8.v[lVar8] * unaff_R15 + uVar20;
      local_e8.v[lVar8 + -1] = (uint)lVar33 & 0x3fffffff;
      *(uint *)((long)&local_b0 + lVar8 * 4 + 4) = (uint)lVar13 & 0x3fffffff;
      lVar8 = lVar8 + 1;
      uVar20 = lVar13 >> 0x1e;
      unaff_RBX = (secp256k1_modinv32_signed30 *)(lVar33 >> 0x1e);
    } while (lVar8 != 9);
    local_a8.v[8] = (int32_t)uVar20;
    unaff_R14 = &local_e8;
    uVar29 = 9;
    uVar5 = 0xffffffff;
    psStack_120 = (secp256k1_modinv32_signed30 *)0x14b58a;
    psVar24 = unaff_R14;
    local_e8.v[8] = (int32_t)unaff_RBX;
    iVar4 = secp256k1_modinv32_mul_cmp_30(unaff_R14,9,&local_110->modulus,-1);
    if (iVar4 < 1) goto LAB_0014b738;
    uVar29 = 9;
    uVar5 = 1;
    psStack_120 = (secp256k1_modinv32_signed30 *)0x14b5a7;
    psVar24 = unaff_R14;
    iVar4 = secp256k1_modinv32_mul_cmp_30(unaff_R14,9,&unaff_R13->modulus,1);
    if (0 < iVar4) goto LAB_0014b73d;
    unaff_R14 = &local_a8;
    uVar29 = 9;
    uVar5 = 0xffffffff;
    psStack_120 = (secp256k1_modinv32_signed30 *)0x14b5c9;
    psVar24 = unaff_R14;
    iVar4 = secp256k1_modinv32_mul_cmp_30(unaff_R14,9,&unaff_R13->modulus,-1);
    if (iVar4 < 1) goto LAB_0014b742;
    uVar29 = 9;
    uVar5 = 1;
    psStack_120 = (secp256k1_modinv32_signed30 *)0x14b5e6;
    psVar24 = unaff_R14;
    iVar4 = secp256k1_modinv32_mul_cmp_30(unaff_R14,9,&unaff_R13->modulus,1);
    if (-1 < iVar4) goto LAB_0014b747;
    iVar4 = local_104 + 1;
  } while (iVar4 != 0x14);
  psVar24 = &local_a8;
  uVar29 = 9;
  uVar5 = 0;
  psStack_120 = (secp256k1_modinv32_signed30 *)0x14b615;
  iVar4 = secp256k1_modinv32_mul_cmp_30(psVar24,9,&SECP256K1_SIGNED30_ONE,0);
  if (iVar4 == 0) {
    psStack_120 = (secp256k1_modinv32_signed30 *)0x14b638;
    iVar4 = secp256k1_modinv32_mul_cmp_30(&local_e8,9,&SECP256K1_SIGNED30_ONE,-1);
    unaff_R14 = local_c0;
    if (iVar4 == 0) {
LAB_0014b6c0:
      psStack_120 = (secp256k1_modinv32_signed30 *)0x14b6d5;
      secp256k1_modinv32_normalize_30(&local_78,(int32_t)unaff_RBX,unaff_R13);
      unaff_R14->v[8] = local_78.v[8];
      *(undefined8 *)(unaff_R14->v + 4) = local_78.v._16_8_;
      *(undefined8 *)(unaff_R14->v + 6) = local_78.v._24_8_;
      *(undefined8 *)unaff_R14->v = local_78.v._0_8_;
      *(undefined8 *)(unaff_R14->v + 2) = local_78.v._8_8_;
      return;
    }
    psStack_120 = (secp256k1_modinv32_signed30 *)0x14b65c;
    iVar4 = secp256k1_modinv32_mul_cmp_30(&local_e8,9,&SECP256K1_SIGNED30_ONE,1);
    if (iVar4 == 0) goto LAB_0014b6c0;
    uVar29 = 9;
    uVar5 = 0;
    psStack_120 = (secp256k1_modinv32_signed30 *)0x14b676;
    psVar24 = unaff_R14;
    iVar4 = secp256k1_modinv32_mul_cmp_30(unaff_R14,9,&SECP256K1_SIGNED30_ONE,0);
    if (iVar4 == 0) {
      psVar24 = &local_78;
      uVar29 = 9;
      uVar5 = 0;
      psStack_120 = (secp256k1_modinv32_signed30 *)0x14b699;
      iVar4 = secp256k1_modinv32_mul_cmp_30(psVar24,9,&SECP256K1_SIGNED30_ONE,0);
      if (iVar4 == 0) {
        psVar24 = &local_e8;
        uVar29 = 9;
        uVar5 = 1;
        psStack_120 = (secp256k1_modinv32_signed30 *)0x14b6b8;
        iVar4 = secp256k1_modinv32_mul_cmp_30(psVar24,9,&unaff_R13->modulus,1);
        if (iVar4 == 0) goto LAB_0014b6c0;
      }
    }
  }
  else {
LAB_0014b74c:
    psStack_120 = (secp256k1_modinv32_signed30 *)0x14b751;
    secp256k1_modinv32_cold_6();
  }
  psStack_120 = (secp256k1_modinv32_signed30 *)secp256k1_modinv32_mul_cmp_30;
  secp256k1_modinv32_cold_7();
  a_01 = &sStack_170;
  piVar18 = (int *)(ulong)uVar5;
  pcStack_178 = (code *)0x14b776;
  psStack_128 = unaff_RBX;
  psStack_120 = unaff_R14;
  secp256k1_modinv32_mul_30(&sStack_14c,psVar24,uVar29,1);
  pcStack_178 = (code *)0x14b788;
  piVar32 = piVar18;
  psVar24 = a_00;
  secp256k1_modinv32_mul_30(&sStack_170,a_00,9,uVar5);
  lVar8 = 0;
  while ((uint)sStack_14c.v[lVar8] < 0x40000000) {
    if (0x3fffffff < (uint)sStack_170.v[lVar8]) goto LAB_0014b7da;
    lVar8 = lVar8 + 1;
    if (lVar8 == 8) {
      uVar5 = 8;
      while( true ) {
        if (sStack_14c.v[uVar5] < sStack_170.v[uVar5]) {
          return;
        }
        if (sStack_170.v[uVar5] < sStack_14c.v[uVar5]) break;
        bVar47 = uVar5 == 0;
        uVar5 = uVar5 - 1;
        if (bVar47) {
          return;
        }
      }
      return;
    }
  }
  pcStack_178 = (code *)0x14b7da;
  secp256k1_modinv32_mul_cmp_30_cold_2();
LAB_0014b7da:
  pcStack_178 = secp256k1_modinv32_update_fg_30_var;
  secp256k1_modinv32_mul_cmp_30_cold_1();
  iVar4 = (int)a_01;
  piStack_1a0 = piVar18;
  uStack_198 = uVar36;
  psStack_190 = unaff_R13;
  uStack_180 = unaff_R15;
  pcStack_178 = (code *)uVar20;
  if (iVar4 < 1) {
    psStack_1b0 = (secp256k1_modinv32_signed30 *)0x14b8cd;
    secp256k1_modinv32_update_fg_30_var_cold_3();
LAB_0014b8cd:
    iVar9 = (int)piVar32;
    psStack_1b0 = (secp256k1_modinv32_signed30 *)0x14b8d2;
    secp256k1_modinv32_update_fg_30_var_cold_1();
  }
  else {
    iVar1 = piVar32[1];
    iVar2 = *piVar32;
    piVar18 = (int *)(long)psVar24->v[0];
    uVar10 = (long)*extraout_RDX * (long)iVar1 + (long)piVar18 * (long)iVar2;
    if ((uVar10 & 0x3fffffff) != 0) goto LAB_0014b8cd;
    iVar3 = piVar32[3];
    iVar9 = piVar32[2];
    piVar18 = (int *)((long)piVar18 * (long)iVar9);
    piVar32 = (int *)((long)*extraout_RDX * (long)iVar3 + (long)piVar18);
    if (((ulong)piVar32 & 0x3fffffff) == 0) {
      lVar13 = (long)piVar32 >> 0x1e;
      lVar8 = (long)uVar10 >> 0x1e;
      if (iVar4 != 1) {
        uVar36 = 1;
        do {
          lVar8 = (long)extraout_RDX[uVar36] * (long)iVar1 +
                  (long)psVar24->v[uVar36] * (long)iVar2 + lVar8;
          lVar13 = (long)extraout_RDX[uVar36] * (long)iVar3 +
                   (long)psVar24->v[uVar36] * (long)iVar9 + lVar13;
          psVar24->v[uVar36 - 1] = (uint)lVar8 & 0x3fffffff;
          extraout_RDX[uVar36 - 1] = (uint)lVar13 & 0x3fffffff;
          uVar36 = uVar36 + 1;
          lVar13 = lVar13 >> 0x1e;
          lVar8 = lVar8 >> 0x1e;
        } while (((ulong)a_01 & 0xffffffff) != uVar36);
      }
      psVar24->v[(long)iVar4 + -1] = (int32_t)lVar8;
      extraout_RDX[(long)iVar4 + -1] = (int)lVar13;
      return;
    }
  }
  psStack_1b0 = (secp256k1_modinv32_signed30 *)secp256k1_modinv32_mul_30;
  secp256k1_modinv32_update_fg_30_var_cold_2();
  lVar8 = 0;
  psStack_1b0 = (secp256k1_modinv32_signed30 *)0x0;
  do {
    if (lVar8 < extraout_EDX) {
      psStack_1b0 = (secp256k1_modinv32_signed30 *)
                    ((long)psStack_1b0->v + (long)psVar24->v[lVar8] * (long)iVar9);
    }
    a_01->v[lVar8] = (uint)psStack_1b0 & 0x3fffffff;
    psStack_1b0 = (secp256k1_modinv32_signed30 *)((long)psStack_1b0 >> 0x1e);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 8);
  if (8 < extraout_EDX) {
    psStack_1b0 = (secp256k1_modinv32_signed30 *)
                  ((long)psStack_1b0->v + (long)psVar24->v[8] * (long)iVar9);
  }
  b = (secp256k1_modinv32_signed30 *)(long)(int)psStack_1b0;
  if (b == psStack_1b0) {
    a_01->v[8] = (int)psStack_1b0;
    return;
  }
  pcStack_1b8 = secp256k1_modinv32_update_de_30;
  secp256k1_modinv32_mul_30_cold_1();
  uVar5 = *extraout_RDX_00;
  psVar40 = (secp256k1_modinv32_signed30 *)(long)(int)uVar5;
  uVar30 = extraout_RDX_00[1];
  lVar8 = (long)(int)uVar30;
  uVar31 = extraout_RDX_00[2];
  psVar19 = (secp256k1_modinv32_signed30 *)(long)(int)uVar31;
  lStack_1f0 = (long)(int)extraout_RDX_00[3];
  psVar22 = (secp256k1_fe *)0x9;
  pcStack_200 = (code *)0x14b96c;
  a_02 = a_01;
  piStack_1e0 = piVar18;
  uStack_1d8 = uVar36;
  psStack_1d0 = unaff_R13;
  uStack_1c0 = unaff_R15;
  pcStack_1b8 = (code *)uVar20;
  iVar4 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,-2);
  if (iVar4 < 1) {
    pcStack_200 = (code *)0x14bbd4;
    secp256k1_modinv32_update_de_30_cold_12();
LAB_0014bbd4:
    pcStack_200 = (code *)0x14bbd9;
    secp256k1_modinv32_update_de_30_cold_11();
LAB_0014bbd9:
    pcStack_200 = (code *)0x14bbde;
    secp256k1_modinv32_update_de_30_cold_10();
LAB_0014bbde:
    pcStack_200 = (code *)0x14bbe3;
    secp256k1_modinv32_update_de_30_cold_9();
LAB_0014bbe3:
    pcStack_200 = (code *)0x14bbe8;
    secp256k1_modinv32_update_de_30_cold_8();
LAB_0014bbe8:
    pcStack_200 = (code *)0x14bbed;
    secp256k1_modinv32_update_de_30_cold_7();
LAB_0014bbed:
    pcStack_200 = (code *)0x14bbf2;
    secp256k1_modinv32_update_de_30_cold_1();
LAB_0014bbf2:
    pcStack_200 = (code *)0x14bbf7;
    secp256k1_modinv32_update_de_30_cold_2();
    psVar37 = b;
LAB_0014bbf7:
    pcStack_200 = (code *)0x14bbfc;
    secp256k1_modinv32_update_de_30_cold_6();
LAB_0014bbfc:
    pcStack_200 = (code *)0x14bc01;
    secp256k1_modinv32_update_de_30_cold_5();
LAB_0014bc01:
    pcStack_200 = (code *)0x14bc06;
    secp256k1_modinv32_update_de_30_cold_4();
  }
  else {
    psVar22 = (secp256k1_fe *)0x9;
    pcStack_200 = (code *)0x14b989;
    a_02 = a_01;
    iVar4 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,1);
    if (-1 < iVar4) goto LAB_0014bbd4;
    psVar22 = (secp256k1_fe *)0x9;
    pcStack_200 = (code *)0x14b9a6;
    a_02 = psVar24;
    iVar4 = secp256k1_modinv32_mul_cmp_30(psVar24,9,b,-2);
    if (iVar4 < 1) goto LAB_0014bbd9;
    psVar22 = (secp256k1_fe *)0x9;
    pcStack_200 = (code *)0x14b9c3;
    a_02 = psVar24;
    iVar4 = secp256k1_modinv32_mul_cmp_30(psVar24,9,b,1);
    if (-1 < iVar4) goto LAB_0014bbde;
    psVar37 = (secp256k1_modinv32_signed30 *)-(long)psVar40;
    if (0 < (long)psVar40) {
      psVar37 = psVar40;
    }
    lVar13 = -lVar8;
    if (lVar8 < 1) {
      lVar13 = lVar8;
    }
    if (lVar13 + 0x40000000 < (long)psVar37) goto LAB_0014bbe3;
    psVar37 = (secp256k1_modinv32_signed30 *)-(long)psVar19;
    if (0 < (long)psVar19) {
      psVar37 = psVar19;
    }
    lVar13 = -lStack_1f0;
    if (lStack_1f0 < 1) {
      lVar13 = lStack_1f0;
    }
    if (lVar13 + 0x40000000 < (long)psVar37) goto LAB_0014bbe8;
    uVar29 = a_01->v[8] >> 0x1f;
    uVar11 = psVar24->v[8] >> 0x1f;
    psVar22 = (secp256k1_fe *)(ulong)uVar11;
    iVar4 = (uVar11 & uVar30) + (uVar29 & uVar5);
    a_02 = (secp256k1_modinv32_signed30 *)(psVar24->v[0] * lVar8 + (long)a_01->v[0] * (long)psVar40)
    ;
    lVar13 = (long)(int)(iVar4 - ((int)a_02 * b[1].v[0] + iVar4 & 0x3fffffffU));
    piVar14 = (int32_t *)((long)a_02->v + lVar13 * b->v[0]);
    if (((ulong)piVar14 & 0x3fffffff) != 0) goto LAB_0014bbed;
    lStack_1e8 = lVar13;
    iVar4 = (uVar11 & (uint)lStack_1f0) + (uVar29 & uVar31);
    lVar33 = psVar24->v[0] * lStack_1f0 + (long)a_01->v[0] * (long)psVar19;
    a_02 = (secp256k1_modinv32_signed30 *)0x3fffffff;
    uVar5 = iVar4 - (b[1].v[0] * (int)lVar33 + iVar4 & 0x3fffffffU);
    psVar22 = (secp256k1_fe *)(ulong)uVar5;
    uVar36 = (long)b->v[0] * (long)(int)uVar5 + lVar33;
    if ((uVar36 & 0x3fffffff) != 0) goto LAB_0014bbf2;
    lVar33 = (long)uVar36 >> 0x1e;
    lVar15 = (long)piVar14 >> 0x1e;
    lVar25 = 1;
    do {
      lVar15 = b->v[lVar25] * lVar13 + psVar24->v[lVar25] * lVar8 +
               (long)a_01->v[lVar25] * (long)psVar40 + lVar15;
      psVar37 = (secp256k1_modinv32_signed30 *)(psVar24->v[lVar25] * lStack_1f0);
      lVar33 = (long)psVar37->v +
               (long)a_01->v[lVar25] * (long)psVar19 + lVar33 +
               (long)b->v[lVar25] * (long)(int)uVar5;
      a_01->v[lVar25 + -1] = (uint)lVar15 & 0x3fffffff;
      psVar24->v[lVar25 + -1] = (uint)lVar33 & 0x3fffffff;
      lVar25 = lVar25 + 1;
      lVar33 = lVar33 >> 0x1e;
      lVar15 = lVar15 >> 0x1e;
    } while (lVar25 != 9);
    a_01->v[8] = (int32_t)lVar15;
    psVar24->v[8] = (int32_t)lVar33;
    psVar22 = (secp256k1_fe *)0x9;
    pcStack_200 = (code *)0x14bb6d;
    a_02 = a_01;
    iVar4 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,-2);
    psVar19 = psVar24;
    psVar40 = b;
    if (iVar4 < 1) goto LAB_0014bbf7;
    psVar22 = (secp256k1_fe *)0x9;
    pcStack_200 = (code *)0x14bb8a;
    a_02 = a_01;
    iVar4 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,1);
    if (-1 < iVar4) goto LAB_0014bbfc;
    psVar22 = (secp256k1_fe *)0x9;
    pcStack_200 = (code *)0x14bba3;
    a_02 = psVar24;
    iVar4 = secp256k1_modinv32_mul_cmp_30(psVar24,9,b,-2);
    if (iVar4 < 1) goto LAB_0014bc01;
    psVar22 = (secp256k1_fe *)0x9;
    pcStack_200 = (code *)0x14bbbc;
    a_02 = psVar24;
    iVar4 = secp256k1_modinv32_mul_cmp_30(psVar24,9,b,1);
    if (iVar4 < 0) {
      return;
    }
  }
  pcStack_200 = secp256k1_modinv32_normalize_30;
  secp256k1_modinv32_update_de_30_cold_3();
  pcStack_200 = (code *)lVar8;
  psStack_208 = a_01;
  psStack_210 = psVar24;
  psStack_218 = psVar40;
  psStack_220 = psVar37;
  psStack_228 = psVar19;
  uVar5 = a_02->v[0];
  uVar23 = (ulong)uVar5;
  uVar30 = a_02->v[3];
  uVar16 = (ulong)uVar30;
  uVar31 = a_02->v[4];
  uVar10 = (ulong)uVar31;
  uVar11 = a_02->v[5];
  uVar20 = (ulong)uVar11;
  psVar24 = (secp256k1_modinv32_signed30 *)(ulong)(uint)a_02->v[6];
  uVar29 = a_02->v[7];
  uVar36 = (ulong)uVar29;
  iStack_22c = a_02->v[8];
  lVar8 = 0;
  do {
    if (a_02->v[lVar8] < -0x3fffffff) {
      pcStack_268 = (code *)0x14bf54;
      secp256k1_modinv32_normalize_30_cold_7();
LAB_0014bf54:
      pcStack_268 = (code *)0x14bf59;
      secp256k1_modinv32_normalize_30_cold_6();
      goto LAB_0014bf59;
    }
    if (0x3fffffff < a_02->v[lVar8]) goto LAB_0014bf54;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 9);
  uStack_24c = (uint)psVar22;
  psVar22 = (secp256k1_fe *)0x9;
  pcStack_268 = (code *)0x14bc91;
  psVar24 = a_02;
  uStack_258 = a_02->v[1];
  uStack_254 = a_02->v[2];
  uStack_250 = a_02->v[6];
  psStack_248 = b_00;
  iVar4 = secp256k1_modinv32_mul_cmp_30(a_02,9,b_00,-2);
  if (iVar4 < 1) {
LAB_0014bf59:
    pcStack_268 = (code *)0x14bf5e;
    secp256k1_modinv32_normalize_30_cold_5();
LAB_0014bf5e:
    pcStack_268 = (code *)0x14bf63;
    secp256k1_modinv32_normalize_30_cold_4();
LAB_0014bf63:
    pcStack_268 = (code *)0x14bf68;
    secp256k1_modinv32_normalize_30_cold_3();
LAB_0014bf68:
    pcStack_268 = (code *)0x14bf6d;
    secp256k1_modinv32_normalize_30_cold_2();
  }
  else {
    psVar22 = (secp256k1_fe *)0x9;
    pcStack_268 = (code *)0x14bcb0;
    psVar24 = a_02;
    iVar4 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_248,1);
    if (-1 < iVar4) goto LAB_0014bf5e;
    uVar6 = iStack_22c >> 0x1f;
    uStack_230 = psStack_248->v[1];
    uVar17 = (uVar6 & uStack_230) + uStack_258;
    uStack_258 = psStack_248->v[2];
    uVar12 = (uVar6 & uStack_258) + uStack_254;
    uStack_254 = psStack_248->v[3];
    uStack_234 = psStack_248->v[4];
    uStack_238 = psStack_248->v[5];
    uStack_23c = psStack_248->v[6];
    uVar38 = (uVar6 & uStack_23c) + uStack_250;
    uStack_250 = psStack_248->v[7];
    uStack_25c = (int)uStack_24c >> 0x1f;
    uStack_24c = psStack_248->v[8];
    uVar34 = ((uVar6 & psStack_248->v[0]) + uVar5 ^ uStack_25c) - uStack_25c;
    uVar42 = ((int)uVar34 >> 0x1e) + ((uVar17 ^ uStack_25c) - uStack_25c);
    uVar17 = ((int)uVar42 >> 0x1e) + ((uVar12 ^ uStack_25c) - uStack_25c);
    uVar44 = ((int)uVar17 >> 0x1e) + (((uVar6 & uStack_254) + uVar30 ^ uStack_25c) - uStack_25c);
    uVar30 = ((int)uVar44 >> 0x1e) + (((uVar6 & uStack_234) + uVar31 ^ uStack_25c) - uStack_25c);
    uVar5 = ((int)uVar30 >> 0x1e) + (((uVar6 & uStack_238) + uVar11 ^ uStack_25c) - uStack_25c);
    uVar31 = ((int)uVar5 >> 0x1e) + ((uVar38 ^ uStack_25c) - uStack_25c);
    uVar11 = ((int)uVar31 >> 0x1e) + (((uVar6 & uStack_250) + uVar29 ^ uStack_25c) - uStack_25c);
    uVar35 = ((int)uVar11 >> 0x1e) + (((uVar6 & uStack_24c) + iStack_22c ^ uStack_25c) - uStack_25c)
    ;
    uVar20 = (ulong)uVar35;
    uStack_260 = (int)uVar35 >> 0x1f;
    uVar38 = (psStack_248->v[0] & uStack_260) + (uVar34 & 0x3fffffff);
    uVar12 = (uStack_238 & uStack_260) + (uVar5 & 0x3fffffff);
    uVar23 = (ulong)uVar12;
    uVar34 = (uStack_23c & uStack_260) + (uVar31 & 0x3fffffff);
    uVar16 = (ulong)uVar34;
    uVar5 = ((int)uVar38 >> 0x1e) + (uStack_230 & uStack_260) + (uVar42 & 0x3fffffff);
    uVar31 = ((int)uVar5 >> 0x1e) + (uStack_258 & uStack_260) + (uVar17 & 0x3fffffff);
    uVar29 = ((int)uVar31 >> 0x1e) + (uStack_254 & uStack_260) + (uVar44 & 0x3fffffff);
    uVar6 = ((int)uVar29 >> 0x1e) + (uStack_234 & uStack_260) + (uVar30 & 0x3fffffff);
    uVar12 = ((int)uVar6 >> 0x1e) + uVar12;
    uVar34 = ((int)uVar12 >> 0x1e) + uVar34;
    uVar30 = ((int)uVar34 >> 0x1e) + (uStack_250 & uStack_260) + (uVar11 & 0x3fffffff);
    uVar11 = ((int)uVar30 >> 0x1e) + (uStack_24c & uStack_260) + uVar35;
    uVar10 = (ulong)uVar11;
    uVar29 = uVar29 & 0x3fffffff;
    psVar22 = (secp256k1_fe *)(ulong)uVar29;
    uVar6 = uVar6 & 0x3fffffff;
    psVar24 = (secp256k1_modinv32_signed30 *)(ulong)uVar6;
    uVar30 = uVar30 & 0x3fffffff;
    uVar36 = (ulong)uVar30;
    a_02->v[0] = uVar38 & 0x3fffffff;
    a_02->v[1] = uVar5 & 0x3fffffff;
    a_02->v[2] = uVar31 & 0x3fffffff;
    a_02->v[3] = uVar29;
    a_02->v[4] = uVar6;
    a_02->v[5] = uVar12 & 0x3fffffff;
    a_02->v[6] = uVar34 & 0x3fffffff;
    a_02->v[7] = uVar30;
    a_02->v[8] = uVar11;
    if (0x3fffffff < uVar11) goto LAB_0014bf63;
    psVar22 = (secp256k1_fe *)0x9;
    pcStack_268 = (code *)0x14bf21;
    psVar24 = a_02;
    iVar4 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_248,0);
    if (iVar4 < 0) goto LAB_0014bf68;
    psVar22 = (secp256k1_fe *)0x9;
    pcStack_268 = (code *)0x14bf3c;
    psVar24 = a_02;
    iVar4 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_248,1);
    if (iVar4 < 0) {
      return;
    }
  }
  pcStack_268 = test_inverse_field;
  secp256k1_modinv32_normalize_30_cold_1();
  psStack_300 = (secp256k1_fe *)secp256k1_fe_inv_var;
  if (extraout_EDX_00 == 0) {
    psStack_300 = (secp256k1_fe *)secp256k1_fe_inv;
  }
  pcStack_350 = (code *)0x14bfa9;
  uStack_290 = uVar36;
  uStack_288 = uVar20;
  uStack_280 = uVar16;
  psStack_278 = a_02;
  uStack_270 = uVar23;
  pcStack_268 = (code *)uVar10;
  (*(code *)psStack_300)(&sStack_338);
  if (psVar24 != (secp256k1_modinv32_signed30 *)0x0) {
    *(uint64_t *)(psVar24->v + 8) = sStack_338.n[4];
    *(ulong *)(psVar24[1].v + 1) = CONCAT44(sStack_338.normalized,sStack_338.magnitude);
    *(uint64_t *)(psVar24->v + 4) = sStack_338.n[2];
    *(uint64_t *)(psVar24->v + 6) = sStack_338.n[3];
    *(uint64_t *)psVar24->v = sStack_338.n[0];
    *(uint64_t *)(psVar24->v + 2) = sStack_338.n[1];
  }
  uVar45 = 0xfffffffffffff;
  uVar41 = 0xf000000000000;
  uVar10 = 0xffffffffffff;
  uVar20 = 0x1000003d0;
  sStack_2c8.n[0] = psVar22->n[0];
  sStack_2c8.n[1] = psVar22->n[1];
  sStack_2c8.n[2] = psVar22->n[2];
  sStack_2c8.n[3] = psVar22->n[3];
  sStack_2c8.n[4] = psVar22->n[4];
  sStack_2c8.magnitude = psVar22->magnitude;
  sStack_2c8.normalized = psVar22->normalized;
  a_03 = &sStack_2c8;
  pcStack_350 = (code *)0x14c020;
  secp256k1_fe_verify(a_03);
  lStack_340 = 0x1000003d1;
  uVar36 = (sStack_2c8.n[4] >> 0x30) * 0x1000003d1 + sStack_2c8.n[0];
  if (((uVar36 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar36 & 0xfffffffffffff) == 0)) {
    uVar16 = (uVar36 >> 0x34) + sStack_2c8.n[1];
    uVar23 = (uVar16 >> 0x34) + sStack_2c8.n[2];
    uVar26 = (uVar23 >> 0x34) + sStack_2c8.n[3];
    uVar28 = (uVar26 >> 0x34) + (sStack_2c8.n[4] & 0xffffffffffff);
    if ((((uVar16 | uVar36 | uVar23 | uVar26) & 0xfffffffffffff) != 0 || uVar28 != 0) &&
       (((uVar36 | 0x1000003d0) & uVar16 & uVar23 & uVar26 & (uVar28 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_0014c0c3;
LAB_0014c4d7:
    psVar22 = &sStack_338;
    pcStack_350 = (code *)0x14c4e4;
    secp256k1_fe_verify(psVar22);
    uVar10 = uVar10 & sStack_338.n[4];
    uVar36 = (sStack_338.n[4] >> 0x30) * lStack_340 + sStack_338.n[0];
    uVar16 = (uVar36 >> 0x34) + sStack_338.n[1];
    uVar23 = (uVar16 >> 0x34) + sStack_338.n[2];
    r = (secp256k1_fe *)((uVar23 >> 0x34) + sStack_338.n[3]);
    uVar26 = ((ulong)r >> 0x34) + uVar10;
    if ((((uVar16 | uVar36 | uVar23 | (ulong)r) & uVar45) == 0 && uVar26 == 0) ||
       (r_00 = (secp256k1_fe *)(uVar26 ^ uVar41),
       ((uVar36 ^ uVar20) & uVar16 & uVar23 & (ulong)r & (ulong)r_00) == uVar45)) {
      return;
    }
  }
  else {
LAB_0014c0c3:
    pcStack_350 = (code *)0x14c0db;
    r = psVar22;
    secp256k1_fe_mul(&sStack_2c8,psVar22,&sStack_338);
    pcStack_350 = (code *)0x14c0e3;
    secp256k1_fe_verify(&sStack_2c8);
    r_00 = &fe_minus_one;
    pcStack_350 = (code *)0x14c0ef;
    secp256k1_fe_verify(&fe_minus_one);
    if (sStack_2c8.magnitude < 0x20) {
      sStack_2c8.n[0] = sStack_2c8.n[0] + 0xffffefffffc2e;
      sStack_2c8.n[1] = sStack_2c8.n[1] + 0xfffffffffffff;
      sStack_2c8.n[2] = sStack_2c8.n[2] + 0xfffffffffffff;
      sStack_2c8.n[3] = sStack_2c8.n[3] + 0xfffffffffffff;
      sStack_2c8.n[4] = sStack_2c8.n[4] + 0xffffffffffff;
      sStack_2c8.normalized = 0;
      sStack_2c8.magnitude = sStack_2c8.magnitude + 1;
      pcStack_350 = (code *)0x14c144;
      secp256k1_fe_verify(&sStack_2c8);
      pcStack_350 = (code *)0x14c14c;
      secp256k1_fe_verify(&sStack_2c8);
      uVar36 = (sStack_2c8.n[4] >> 0x30) * lStack_340 + sStack_2c8.n[0];
      uVar10 = (uVar36 >> 0x34) + sStack_2c8.n[1];
      uVar16 = (uVar10 >> 0x34) + sStack_2c8.n[2];
      r = (secp256k1_fe *)((uVar16 >> 0x34) + sStack_2c8.n[3]);
      uVar23 = ((ulong)r >> 0x34) + (sStack_2c8.n[4] & 0xffffffffffff);
      if ((((uVar10 | uVar36 | uVar16 | (ulong)r) & 0xfffffffffffff) != 0 || uVar23 != 0) &&
         (r_00 = (secp256k1_fe *)(uVar23 ^ 0xf000000000000),
         ((uVar36 ^ 0x1000003d0) & uVar10 & uVar16 & (ulong)r & (ulong)r_00) != 0xfffffffffffff))
      goto LAB_0014c565;
      sStack_2f8.n[0] = psVar22->n[0];
      sStack_2f8.n[1] = psVar22->n[1];
      sStack_2f8.n[2] = psVar22->n[2];
      sStack_2f8.n[3] = psVar22->n[3];
      sStack_2f8.n[4] = psVar22->n[4];
      sStack_2f8.magnitude = psVar22->magnitude;
      sStack_2f8.normalized = psVar22->normalized;
      psVar22 = &sStack_2f8;
      pcStack_350 = (code *)0x14c1e4;
      secp256k1_fe_verify(psVar22);
      r_00 = &fe_minus_one;
      pcStack_350 = (code *)0x14c1f0;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_2f8.magnitude) goto LAB_0014c56a;
      uVar21 = sStack_2f8.n[0] + 0xffffefffffc2e;
      uVar43 = sStack_2f8.n[1] + 0xfffffffffffff;
      uVar45 = sStack_2f8.n[2] + 0xfffffffffffff;
      uVar41 = sStack_2f8.n[3] + 0xfffffffffffff;
      uVar20 = sStack_2f8.n[4] + 0xffffffffffff;
      sStack_2f8.normalized = 0;
      sStack_2f8.magnitude = sStack_2f8.magnitude + 1;
      pcStack_350 = (code *)0x14c265;
      sStack_2f8.n[0] = uVar21;
      sStack_2f8.n[1] = uVar43;
      sStack_2f8.n[2] = uVar45;
      sStack_2f8.n[3] = uVar41;
      sStack_2f8.n[4] = uVar20;
      secp256k1_fe_verify(&sStack_2f8);
      pcStack_350 = (code *)0x14c26d;
      secp256k1_fe_verify(&sStack_2f8);
      a_03 = psStack_300;
      uVar36 = (uVar20 >> 0x30) * lStack_340 + uVar21;
      if (((uVar36 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar36 & 0xfffffffffffff) == 0)) {
        uVar20 = uVar20 & 0xffffffffffff;
        uVar26 = uVar43 + (uVar36 >> 0x34);
        uVar10 = (uVar26 >> 0x34) + uVar45;
        uVar16 = (uVar10 >> 0x34) + uVar41;
        uVar23 = (uVar16 >> 0x34) + uVar20;
        if (((uVar26 | uVar36 | uVar10 | uVar16) & 0xfffffffffffff) == 0 && uVar23 == 0) {
          return;
        }
        if (((uVar36 | 0x1000003d0) & uVar26 & uVar10 & uVar16 & (uVar23 ^ 0xf000000000000)) ==
            0xfffffffffffff) {
          return;
        }
      }
      r = &sStack_2f8;
      pcStack_350 = (code *)0x14c32d;
      (*(code *)psStack_300)();
      psVar22 = &sStack_338;
      pcStack_350 = (code *)0x14c33a;
      secp256k1_fe_verify(psVar22);
      r_00 = &fe_minus_one;
      pcStack_350 = (code *)0x14c346;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_338.magnitude) goto LAB_0014c56f;
      psVar22 = &sStack_338;
      sStack_338.n[0] = sStack_338.n[0] + 0xffffefffffc2e;
      sStack_338.n[1] = sStack_338.n[1] + 0xfffffffffffff;
      sStack_338.n[2] = sStack_338.n[2] + 0xfffffffffffff;
      sStack_338.n[3] = sStack_338.n[3] + 0xfffffffffffff;
      sStack_338.n[4] = sStack_338.n[4] + 0xffffffffffff;
      sStack_338.magnitude = sStack_338.magnitude + 1;
      uVar10 = 0;
      sStack_338.normalized = 0;
      pcStack_350 = (code *)0x14c38f;
      secp256k1_fe_verify(psVar22);
      pcStack_350 = (code *)0x14c398;
      r = psVar22;
      (*(code *)a_03)(psVar22);
      pcStack_350 = (code *)0x14c3a0;
      secp256k1_fe_verify(psVar22);
      sStack_338.n[0] = sStack_338.n[0] + 1;
      sStack_338.magnitude = sStack_338.magnitude + 1;
      sStack_338.normalized = 0;
      pcStack_350 = (code *)0x14c3b1;
      secp256k1_fe_verify(psVar22);
      pcStack_350 = (code *)0x14c3b9;
      secp256k1_fe_verify(psVar22);
      a_03 = &sStack_2f8;
      pcStack_350 = (code *)0x14c3c6;
      r_00 = a_03;
      secp256k1_fe_verify(a_03);
      if (sStack_2f8.magnitude + sStack_338.magnitude < 0x21) {
        sStack_338.n[0] = sStack_338.n[0] + sStack_2f8.n[0];
        sStack_338.n[1] = sStack_338.n[1] + sStack_2f8.n[1];
        sStack_338.n[2] = sStack_338.n[2] + sStack_2f8.n[2];
        sStack_338.n[3] = sStack_338.n[3] + sStack_2f8.n[3];
        sStack_338.n[4] = sStack_338.n[4] + sStack_2f8.n[4];
        sStack_338.normalized = 0;
        pcStack_350 = (code *)0x14c414;
        sStack_338.magnitude = sStack_2f8.magnitude + sStack_338.magnitude;
        secp256k1_fe_verify(&sStack_338);
        pcStack_350 = (code *)0x14c41c;
        secp256k1_fe_verify(&sStack_338);
        uVar36 = (sStack_338.n[4] >> 0x30) * lStack_340 + sStack_338.n[0];
        if (((uVar36 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar36 & 0xfffffffffffff) == 0)) {
          uVar16 = (uVar36 >> 0x34) + sStack_338.n[1];
          uVar23 = (uVar16 >> 0x34) + sStack_338.n[2];
          uVar26 = (uVar23 >> 0x34) + sStack_338.n[3];
          uVar28 = (uVar26 >> 0x34) + (sStack_338.n[4] & 0xffffffffffff);
          if (((uVar16 | uVar36 | uVar23 | uVar26) & 0xfffffffffffff) == 0 && uVar28 == 0) {
            return;
          }
          if (((uVar36 | 0x1000003d0) & uVar16 & uVar23 & uVar26 & (uVar28 ^ 0xf000000000000)) ==
              0xfffffffffffff) {
            return;
          }
        }
        pcStack_350 = (code *)0x14c4d7;
        test_inverse_field_cold_2();
        goto LAB_0014c4d7;
      }
    }
    else {
      pcStack_350 = (code *)0x14c565;
      test_inverse_field_cold_7();
LAB_0014c565:
      pcStack_350 = (code *)0x14c56a;
      test_inverse_field_cold_6();
LAB_0014c56a:
      a_03 = &sStack_2c8;
      pcStack_350 = (code *)0x14c56f;
      test_inverse_field_cold_5();
LAB_0014c56f:
      uVar10 = 0xffffffffffff;
      pcStack_350 = (code *)0x14c574;
      test_inverse_field_cold_4();
    }
    pcStack_350 = (code *)0x14c579;
    test_inverse_field_cold_3();
  }
  pcStack_350 = test_inverse_scalar;
  test_inverse_field_cold_1();
  psVar27 = (secp256k1_fe *)auStack_3c0;
  pcVar46 = secp256k1_scalar_inverse_var;
  if (extraout_EDX_01 == 0) {
    pcVar46 = secp256k1_scalar_inverse;
  }
  pcStack_3c8 = (code *)0x14c5a7;
  auStack_380._32_8_ = psVar22;
  auStack_380._40_8_ = a_03;
  pcStack_350 = (code *)uVar45;
  (*pcVar46)(auStack_3c0);
  if (r_00 != (secp256k1_fe *)0x0) {
    r_00->n[2] = CONCAT44(auStack_3c0._20_4_,auStack_3c0._16_4_);
    r_00->n[3] = CONCAT44(auStack_3c0._28_4_,auStack_3c0._24_4_);
    r_00->n[0] = CONCAT44(auStack_3c0._4_4_,auStack_3c0._0_4_);
    r_00->n[1] = CONCAT44(auStack_3c0._12_4_,auStack_3c0._8_4_);
  }
  pcStack_3c8 = (code *)0x14c5c6;
  secp256k1_scalar_verify((secp256k1_scalar *)r);
  auVar48._0_4_ = -(uint)((int)r->n[2] == 0 && (int)r->n[0] == 0);
  auVar48._4_4_ = -(uint)(*(int *)((long)r->n + 0x14) == 0 && *(int *)((long)r->n + 4) == 0);
  auVar48._8_4_ = -(uint)((int)r->n[3] == 0 && (int)r->n[1] == 0);
  auVar48._12_4_ = -(uint)(*(int *)((long)r->n + 0x1c) == 0 && *(int *)((long)r->n + 0xc) == 0);
  iVar4 = movmskps(extraout_EAX,auVar48);
  if (iVar4 != 0xf) {
    r_00 = (secp256k1_fe *)auStack_380;
    pcStack_3c8 = (code *)0x14c5fa;
    secp256k1_scalar_mul
              ((secp256k1_scalar *)r_00,(secp256k1_scalar *)r,(secp256k1_scalar *)auStack_3c0);
    pcStack_3c8 = (code *)0x14c602;
    psVar22 = r_00;
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    if (((auStack_380._0_8_ != 1 || auStack_380._8_8_ != 0) || auStack_380._16_8_ != 0) ||
        auStack_380._24_8_ != 0) {
      pcStack_3c8 = (code *)0x14c70c;
      test_inverse_scalar_cold_1();
      goto LAB_0014c70c;
    }
    pcStack_3c8 = (code *)0x14c632;
    secp256k1_scalar_add
              ((secp256k1_scalar *)(auStack_3c0 + 0x20),(secp256k1_scalar *)r,&scalar_minus_one);
    pcStack_3c8 = (code *)0x14c63a;
    secp256k1_scalar_verify((secp256k1_scalar *)(auStack_3c0 + 0x20));
    auVar49._0_4_ = -(uint)(iStack_390 == 0 && auStack_3c0._32_4_ == 0);
    auVar49._4_4_ = -(uint)(iStack_38c == 0 && iStack_39c == 0);
    auVar49._8_4_ = -(uint)(iStack_388 == 0 && iStack_398 == 0);
    auVar49._12_4_ = -(uint)(iStack_384 == 0 && iStack_394 == 0);
    iVar4 = movmskps(extraout_EAX_00,auVar49);
    if (iVar4 == 0xf) {
      return;
    }
    a = (secp256k1_scalar *)(auStack_3c0 + 0x20);
    pcStack_3c8 = (code *)0x14c66b;
    (*pcVar46)(a,a);
    pcStack_3c8 = (code *)0x14c680;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_3c0,&scalar_minus_one,(secp256k1_scalar *)auStack_3c0);
    pcStack_3c8 = (code *)0x14c689;
    (*pcVar46)(auStack_3c0,auStack_3c0);
    pcStack_3c8 = (code *)0x14c69b;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_3c0,(secp256k1_scalar *)auStack_3c0,&secp256k1_scalar_one
              );
    pcStack_3c8 = (code *)0x14c6a9;
    secp256k1_scalar_add((secp256k1_scalar *)auStack_3c0,a,(secp256k1_scalar *)auStack_3c0);
    pcStack_3c8 = (code *)0x14c6b1;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_3c0);
    auVar50._0_4_ = -(uint)(auStack_3c0._16_4_ == 0 && auStack_3c0._0_4_ == 0);
    auVar50._4_4_ = -(uint)(auStack_3c0._20_4_ == 0 && auStack_3c0._4_4_ == 0);
    auVar50._8_4_ = -(uint)(auStack_3c0._24_4_ == 0 && auStack_3c0._8_4_ == 0);
    auVar50._12_4_ = -(uint)(auStack_3c0._28_4_ == 0 && auStack_3c0._12_4_ == 0);
    iVar4 = movmskps(extraout_EAX_01,auVar50);
    if (iVar4 == 0xf) {
      return;
    }
    pcStack_3c8 = (code *)0x14c6d5;
    test_inverse_scalar_cold_2();
    r_00 = (secp256k1_fe *)auStack_3c0;
  }
  pcStack_3c8 = (code *)0x14c6e0;
  secp256k1_scalar_verify((secp256k1_scalar *)auStack_3c0);
  auVar51._0_4_ = -(uint)(auStack_3c0._16_4_ == 0 && auStack_3c0._0_4_ == 0);
  auVar51._4_4_ = -(uint)(auStack_3c0._20_4_ == 0 && auStack_3c0._4_4_ == 0);
  auVar51._8_4_ = -(uint)(auStack_3c0._24_4_ == 0 && auStack_3c0._8_4_ == 0);
  auVar51._12_4_ = -(uint)(auStack_3c0._28_4_ == 0 && auStack_3c0._12_4_ == 0);
  iVar4 = movmskps(extraout_EAX_02,auVar51);
  r = (secp256k1_fe *)auStack_3c0;
  psVar22 = psVar27;
  if (iVar4 == 0xf) {
    return;
  }
LAB_0014c70c:
  pcStack_3c8 = test_hsort;
  test_inverse_scalar_cold_3();
  __s = auStack_1478;
  psStack_3f0 = r;
  uStack_3e8 = uVar20;
  uStack_3e0 = uVar41;
  psStack_3d8 = r_00;
  pcStack_3d0 = pcVar46;
  pcStack_3c8 = (code *)uVar10;
  memset(__s,0,0x1081);
  uStack_1488 = 0;
  lVar8 = 0x41;
  psStack_1480 = psVar22;
  secp256k1_hsort(__s,0x41,(size_t)psVar22,test_hsort_cmp,&uStack_1488);
  if (0x3f < uStack_1488) {
    test_hsort_is_sorted(auStack_1478,0x41,(size_t)psVar22);
    if (0 < COUNT) {
      iVar4 = 0;
      do {
        uVar7 = testrand_int(0x41);
        count = (size_t)(int)uVar7;
        testrand_bytes_test(auStack_1478,count * (long)psVar22);
        secp256k1_hsort(auStack_1478,count,(size_t)psVar22,test_hsort_cmp,&uStack_1488);
        test_hsort_is_sorted(auStack_1478,count,(size_t)psVar22);
        iVar4 = iVar4 + 1;
      } while (iVar4 < COUNT);
    }
    return;
  }
  test_hsort_cold_1();
  *extraout_RDX_01 = *extraout_RDX_01 + 1;
  if (extraout_RDX_01[1] != 0) {
    lVar13 = 0;
    do {
      if (__s[lVar13] != *(uchar *)(lVar8 + lVar13)) {
        return;
      }
      lVar13 = lVar13 + 1;
    } while (extraout_RDX_01[1] != lVar13);
  }
  return;
}

Assistant:

static void secp256k1_modinv32(secp256k1_modinv32_signed30 *x, const secp256k1_modinv32_modinfo *modinfo) {
    /* Start with d=0, e=1, f=modulus, g=x, zeta=-1. */
    secp256k1_modinv32_signed30 d = {{0}};
    secp256k1_modinv32_signed30 e = {{1}};
    secp256k1_modinv32_signed30 f = modinfo->modulus;
    secp256k1_modinv32_signed30 g = *x;
    int i;
    int32_t zeta = -1; /* zeta = -(delta+1/2); delta is initially 1/2. */

    /* Do 20 iterations of 30 divsteps each = 600 divsteps. 590 suffices for 256-bit inputs. */
    for (i = 0; i < 20; ++i) {
        /* Compute transition matrix and new zeta after 30 divsteps. */
        secp256k1_modinv32_trans2x2 t;
        zeta = secp256k1_modinv32_divsteps_30(zeta, f.v[0], g.v[0], &t);
        /* Update d,e using that transition matrix. */
        secp256k1_modinv32_update_de_30(&d, &e, &t, modinfo);
        /* Update f,g using that transition matrix. */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, 1) < 0);  /* g <  modulus */

        secp256k1_modinv32_update_fg_30(&f, &g, &t);

        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, 1) < 0);  /* g <  modulus */
    }

    /* At this point sufficient iterations have been performed that g must have reached 0
     * and (if g was not originally 0) f must now equal +/- GCD of the initial f, g
     * values i.e. +/- 1, and d now contains +/- the modular inverse. */

    /* g == 0 */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &SECP256K1_SIGNED30_ONE, 0) == 0);
    /* |f| == 1, or (x == 0 and d == 0 and f == modulus) */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &SECP256K1_SIGNED30_ONE, -1) == 0 ||
                 secp256k1_modinv32_mul_cmp_30(&f, 9, &SECP256K1_SIGNED30_ONE, 1) == 0 ||
                 (secp256k1_modinv32_mul_cmp_30(x, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 &&
                  secp256k1_modinv32_mul_cmp_30(&d, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 &&
                  secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, 1) == 0));

    /* Optionally negate d, normalize to [0,modulus), and return it. */
    secp256k1_modinv32_normalize_30(&d, f.v[8], modinfo);
    *x = d;
}